

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::Select(w3Interp *this)

{
  w3Stack *this_00;
  pointer pwVar1;
  int32_t iVar2;
  w3StackValue val2;
  w3StackValue local_48;
  
  this_00 = &this->super_w3Stack;
  iVar2 = w3Stack::pop_i32(this_00);
  if (iVar2 == 0) {
    pwVar1 = (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
             super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_48.tag = pwVar1[-1].tag;
    local_48._1_7_ = *(undefined7 *)&pwVar1[-1].field_0x1;
    local_48.value.tag = pwVar1[-1].value.tag;
    local_48.value._1_7_ = *(undefined7 *)&pwVar1[-1].value.field_0x1;
    local_48.value.value = pwVar1[-1].value.value;
    local_48.frame = pwVar1[-1].frame;
    local_48.label.arity = pwVar1[-1].label.arity;
    local_48.label.continuation = pwVar1[-1].label.continuation;
    w3Stack::pop_value(this_00);
    w3Stack::pop_value(this_00);
    w3Stack::push_value(this_00,&local_48);
    return;
  }
  w3Stack::pop_value(this_00);
  if ((this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    w3Stack::AssertTopIsValue(this_00);
    return;
  }
  AssertFailed("size () >= 1");
}

Assistant:

INTERP (Select)
{
    if (pop_i32 ())
    {
        pop_value ();
        Assert (size () >= 1);
        AssertTopIsValue ();
    }
    else
    {
        const w3StackValue val2 = top ();
        pop_value ();
        pop_value ();
        push_value (val2);
    }
}